

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  size_t sVar2;
  bad_alloc *anon_var_0;
  string local_2130 [55];
  allocator local_20f9;
  string local_20f8 [32];
  _union_1457 _Stack_20d8;
  sigaction sa;
  char local_2033 [3];
  int local_2030;
  char endChars [3];
  int opt;
  bool validationCheck;
  bool uncompressedSize;
  bool zip;
  char idxFileName [4096];
  char binFileName [4096];
  bool local_1d;
  int local_1c;
  bool hasIntensityUncertainty;
  int maxIntensityBinIdx;
  char **argv_local;
  int argc_local;
  
  progname = *argv;
  local_1c = -1;
  local_1d = true;
  memcpy(idxFileName + 0xff8,"footprint.bin",0x1000);
  memcpy(&opt,"footprint.idx",0x1000);
  endChars[2] = '\0';
  endChars[1] = '\0';
  endChars[0] = '\x01';
  do {
    local_2030 = getopt(argc,argv,"i:nb:x:zuNhv");
    if (local_2030 == -1) {
      if (local_1c == -1) {
        fprintf(_stderr,"ERROR: Intensity bin parameter not supplied.\n");
        exit(1);
      }
      if (((endChars[1] & 1U) != 0) && ((endChars[2] & 1U) == 0)) {
        fprintf(_stderr,
                "WARNING: Zip footprint data argument not supplied. Ignoring request to include uncompressed data size in index file.\n"
               );
        endChars[1] = '\0';
      }
      if ((endChars[2] & 1U) != 0) {
        sVar2 = strlen(idxFileName + 0xff8);
        if (sVar2 < 2) {
          strcat(idxFileName + 0xff8,".z");
        }
        else {
          sVar2 = strlen(idxFileName + 0xff8);
          strcpy(local_2033,idxFileName + sVar2 + 0xff6);
          iVar1 = strcmp(local_2033,".z");
          if (iVar1 != 0) {
            strcat(idxFileName + 0xff8,".z");
          }
        }
        sVar2 = strlen((char *)&opt);
        if (sVar2 < 2) {
          strcat((char *)&opt,".z");
        }
        else {
          sVar2 = strlen((char *)&opt);
          strcpy(local_2033,endChars + sVar2 + 1);
          iVar1 = strcmp(local_2033,".z");
          if (iVar1 != 0) {
            strcat((char *)&opt,".z");
          }
        }
      }
      sa.sa_mask.__val[0xe] = 0;
      sa.sa_mask.__val[0xf] = 0;
      sa.sa_mask.__val[0xc] = 0;
      sa.sa_mask.__val[0xd] = 0;
      sa.sa_mask.__val[10] = 0;
      sa.sa_mask.__val[0xb] = 0;
      sa.sa_mask.__val[8] = 0;
      sa.sa_mask.__val[9] = 0;
      sa.sa_mask.__val[6] = 0;
      sa.sa_mask.__val[7] = 0;
      sa.sa_mask.__val[4] = 0;
      sa.sa_mask.__val[5] = 0;
      sa.sa_mask.__val[2] = 0;
      sa.sa_mask.__val[3] = 0;
      sa.sa_mask.__val[0] = 0;
      sa.sa_mask.__val[1] = 0;
      _Stack_20d8.sa_handler = (__sighandler_t)0x0;
      sa.__sigaction_handler.sa_handler = (__sighandler_t)0x0;
      sa.sa_flags = 0;
      sa._140_4_ = 0;
      sigemptyset((sigset_t *)&sa);
      _Stack_20d8.sa_handler = SegFaultSigAction;
      sa.sa_mask.__val[0xf] = CONCAT44(sa.sa_mask.__val[0xf]._4_4_,4);
      sigaction(0xb,(sigaction *)&_Stack_20d8,(sigaction *)0x0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_20f8,"",&local_20f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2130,"",(allocator *)((long)&anon_var_0 + 7));
      initstreams((string *)local_20f8,(string *)local_2130);
      std::__cxx11::string::~string(local_2130);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
      std::__cxx11::string::~string(local_20f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_20f9);
      DoIt(local_1c,local_1d,idxFileName + 0xff8,(char *)&opt,(bool)(endChars[1] & 1),
           (bool)(endChars[2] & 1),(bool)(endChars[0] & 1));
      return 0;
    }
    switch(local_2030) {
    case 0x4e:
      endChars[0] = '\0';
      break;
    case 0x62:
      strcpy(idxFileName + 0xff8,_optarg);
      break;
    case 0x68:
    default:
      Help();
      exit(1);
    case 0x69:
      local_1c = atoi(_optarg);
      break;
    case 0x6e:
      local_1d = false;
      break;
    case 0x75:
      endChars[1] = '\x01';
      break;
    case 0x76:
      fprintf(_stderr,"%s : version : %s\n",*argv,"");
      exit(1);
    case 0x78:
      strcpy((char *)&opt,_optarg);
      break;
    case 0x7a:
      endChars[2] = '\x01';
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {

  progname = argv[0];
  int maxIntensityBinIdx = -1;
  bool hasIntensityUncertainty = true;
  char binFileName[4096] = "footprint.bin";
  char idxFileName[4096] = "footprint.idx";
  bool zip = false;
  bool uncompressedSize = false;
  bool validationCheck = true;
  int opt;
  while ((opt = getopt(argc, argv, "i:nb:x:zuNhv")) != -1) {
    switch (opt) {
      case 'i':
        maxIntensityBinIdx = atoi(optarg);
	break;
      case 'n':
	hasIntensityUncertainty = false;
	break;
      case 'b':
	strcpy(binFileName, optarg);
	break;
      case 'x':
	strcpy(idxFileName, optarg);
	break;
      case 'z':
	zip = true;
	break;
      case 'u':
	uncompressedSize = true;
	break;
      case 'N':
	validationCheck = false;
	break;
      case 'v':
#ifdef AREAPERIL_TYPE_UNSIGNED_LONG_LONG
        fprintf(stderr, "%s : version : %s :"
			" Areaperil ID data type unsigned long long\n",
		argv[0], VERSION);
#else
	fprintf(stderr, "%s : version : %s\n", argv[0], VERSION);
#endif
        exit(EXIT_FAILURE);
      case 'h':
      default:
	Help();
	exit(EXIT_FAILURE);
    }
  }

  if (maxIntensityBinIdx == -1) {
    fprintf(stderr, "ERROR: Intensity bin parameter not supplied.\n");
    exit(EXIT_FAILURE);
  }

  if (uncompressedSize && !zip) {
    fprintf(stderr, "WARNING: Zip footprint data argument not supplied."
		    " Ignoring request to include uncompressed data size in"
		    " index file.\n");
    uncompressedSize = false;
  }

  // Ensure zip file names have .z suffix
  if (zip) {
    char endChars[3];

    if (strlen(binFileName) < 2) {
      strcat(binFileName, ".z");
    } else {
      strcpy(endChars, binFileName + (strlen(binFileName) - 2));
      if (strcmp(endChars, ".z")) strcat(binFileName, ".z");
    }

    if (strlen(idxFileName) < 2) {
      strcat(idxFileName, ".z");
    } else {
      strcpy(endChars, idxFileName + (strlen(idxFileName) - 2));
      if (strcmp(endChars, ".z")) strcat(idxFileName, ".z");
    }
  }

#if !defined(_MSC_VER) && !defined(__MINGW32__)
  struct sigaction sa;

  memset(&sa, 0, sizeof(struct sigaction));
  sigemptyset(&sa.sa_mask);
  sa.sa_sigaction = SegFaultSigAction;
  sa.sa_flags = SA_SIGINFO;

  sigaction(SIGSEGV, &sa, NULL);
#endif

  try {

    initstreams();
    DoIt(maxIntensityBinIdx, hasIntensityUncertainty, binFileName, idxFileName,
	 uncompressedSize, zip, validationCheck);
    return 0;

  } catch (std::bad_alloc&) {

    fprintf(stderr, "ERROR: %s: Memory allocation failed.\n", progname);
    exit(EXIT_FAILURE);

  }

}